

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O1

aspa_status
aspa_table_src_replace
          (aspa_table *dst,aspa_table *src,rtr_socket *rtr_socket,_Bool notify_dst,_Bool notify_src)

{
  pthread_rwlock_t *__rwlock;
  pthread_rwlock_t *__rwlock_00;
  aspa_store_node **ppaVar1;
  long lVar2;
  aspa_array *array;
  aspa_store_node *paVar3;
  aspa_store_node **ppaVar4;
  aspa_store_node *paVar5;
  aspa_record *paVar6;
  aspa_store_node **ppaVar7;
  size_t sVar8;
  aspa_status aVar9;
  aspa_array *array_00;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  aVar9 = ASPA_ERROR;
  if ((((rtr_socket == (rtr_socket *)0x0) || (src == dst)) || (dst == (aspa_table *)0x0)) ||
     (src == (aspa_table *)0x0)) goto LAB_0010cb3c;
  __rwlock = &dst->update_lock;
  pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  __rwlock_00 = &src->update_lock;
  pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock_00);
  pthread_rwlock_wrlock((pthread_rwlock_t *)dst);
  pthread_rwlock_wrlock((pthread_rwlock_t *)src);
  paVar5 = src->store;
  if (paVar5 == (aspa_store_node *)0x0) {
    ppaVar7 = (aspa_store_node **)0x0;
  }
  else if (paVar5->rtr_socket == rtr_socket) {
    ppaVar7 = &src->store;
  }
  else {
    ppaVar7 = (aspa_store_node **)0x0;
    do {
      paVar3 = paVar5;
      paVar5 = paVar3->next;
      if (paVar5 == (aspa_store_node *)0x0) goto LAB_0010c978;
    } while (paVar5->rtr_socket != rtr_socket);
    ppaVar7 = &paVar3->next;
  }
LAB_0010c978:
  if (((ppaVar7 == (aspa_store_node **)0x0) || (*ppaVar7 == (aspa_store_node *)0x0)) ||
     (array = (*ppaVar7)->aspa_array, array == (aspa_array *)0x0)) {
LAB_0010cb18:
    pthread_rwlock_unlock((pthread_rwlock_t *)src);
    pthread_rwlock_unlock((pthread_rwlock_t *)dst);
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock_00);
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  }
  else {
    ppaVar1 = &dst->store;
    paVar5 = dst->store;
    if (paVar5 == (aspa_store_node *)0x0 || rtr_socket == (rtr_socket *)0x0) {
      ppaVar4 = (aspa_store_node **)0x0;
    }
    else {
      ppaVar4 = ppaVar1;
      if (paVar5->rtr_socket != rtr_socket) {
        ppaVar4 = (aspa_store_node **)0x0;
        do {
          paVar3 = paVar5;
          paVar5 = paVar3->next;
          if (paVar5 == (aspa_store_node *)0x0) goto LAB_0010c9da;
        } while (paVar5->rtr_socket != rtr_socket);
        ppaVar4 = &paVar3->next;
      }
    }
LAB_0010c9da:
    if ((ppaVar4 == (aspa_store_node **)0x0) ||
       (paVar5 = *ppaVar4, paVar5 == (aspa_store_node *)0x0)) {
      paVar5 = (aspa_store_node *)lrtr_malloc(0x18);
      if (paVar5 == (aspa_store_node *)0x0) goto LAB_0010cb18;
      paVar5->rtr_socket = rtr_socket;
      paVar5->aspa_array = array;
      paVar5->next = *ppaVar1;
      *ppaVar1 = paVar5;
      array_00 = (aspa_array *)0x0;
    }
    else {
      array_00 = paVar5->aspa_array;
      paVar5->aspa_array = array;
    }
    paVar5 = *ppaVar7;
    *ppaVar7 = paVar5->next;
    lrtr_free(paVar5);
    pthread_rwlock_unlock((pthread_rwlock_t *)src);
    pthread_rwlock_unlock((pthread_rwlock_t *)dst);
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock_00);
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    if ((notify_src) && (array->size != 0)) {
      sVar8 = 0;
      do {
        paVar6 = aspa_array_get_record(array,sVar8);
        aspa_table_notify_clients(src,paVar6,rtr_socket,ASPA_REMOVE);
        sVar8 = sVar8 + 1;
      } while (sVar8 < array->size);
    }
    if (array_00 != (aspa_array *)0x0) {
      if ((notify_dst) && (array_00->size != 0)) {
        sVar8 = 0;
        do {
          paVar6 = aspa_array_get_record(array_00,sVar8);
          aspa_table_notify_clients(dst,paVar6,rtr_socket,ASPA_REMOVE);
          sVar8 = sVar8 + 1;
        } while (sVar8 < array_00->size);
      }
      aspa_array_free(array_00,true);
    }
    aVar9 = ASPA_SUCCESS;
    if ((notify_dst) && (aVar9 = ASPA_SUCCESS, array->size != 0)) {
      aVar9 = ASPA_SUCCESS;
      sVar8 = 0;
      do {
        paVar6 = aspa_array_get_record(array,sVar8);
        aspa_table_notify_clients(dst,paVar6,rtr_socket,ASPA_ADD);
        sVar8 = sVar8 + 1;
      } while (sVar8 < array->size);
    }
  }
LAB_0010cb3c:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return aVar9;
}

Assistant:

enum aspa_status aspa_table_src_replace(struct aspa_table *dst, struct aspa_table *src, struct rtr_socket *rtr_socket,
					bool notify_dst, bool notify_src)
{
	if (!dst || !src || !rtr_socket || src == dst)
		return ASPA_ERROR;

	pthread_rwlock_wrlock(&dst->update_lock);
	pthread_rwlock_wrlock(&src->update_lock);
	pthread_rwlock_wrlock(&dst->lock);
	pthread_rwlock_wrlock(&src->lock);

	struct aspa_store_node **src_node = aspa_store_get_node(&src->store, rtr_socket);

	if (!src_node || !*src_node || !(*src_node)->aspa_array) {
		pthread_rwlock_unlock(&src->lock);
		pthread_rwlock_unlock(&dst->lock);
		pthread_rwlock_unlock(&src->update_lock);
		pthread_rwlock_unlock(&dst->update_lock);
		return ASPA_ERROR;
	}

	struct aspa_array *new_array = (*src_node)->aspa_array;
	struct aspa_array *old_array = NULL;

	// Try to get an existing node in the source table's store
	struct aspa_store_node **existing_dst_node = aspa_store_get_node(&dst->store, rtr_socket);

	if (existing_dst_node && *existing_dst_node) {
		// Swap array
		old_array = (*existing_dst_node)->aspa_array;
		(*existing_dst_node)->aspa_array = new_array;
	} else {
		// There's no old_array.
		// Destination table hasn't got an existing store node for the socket, so create a new one
		if (aspa_store_create_node(&dst->store, rtr_socket, new_array, NULL) != ASPA_SUCCESS) {
			pthread_rwlock_unlock(&src->lock);
			pthread_rwlock_unlock(&dst->lock);
			pthread_rwlock_unlock(&src->update_lock);
			pthread_rwlock_unlock(&dst->update_lock);
			return ASPA_ERROR;
		}
	}

	// Remove socket from source table's store
	aspa_store_remove_node(src_node);
	pthread_rwlock_unlock(&src->lock);
	pthread_rwlock_unlock(&dst->lock);
	pthread_rwlock_unlock(&src->update_lock);
	pthread_rwlock_unlock(&dst->update_lock);

	if (notify_src)
		// Notify src clients their records are being removed
		for (size_t i = 0; i < new_array->size; i++)
			aspa_table_notify_clients(src, aspa_array_get_record(new_array, i), rtr_socket, ASPA_REMOVE);

	if (old_array) {
		if (notify_dst)
			// Notify dst clients of their existing records are being removed
			for (size_t i = 0; i < old_array->size; i++)
				aspa_table_notify_clients(dst, aspa_array_get_record(old_array, i), rtr_socket,
							  ASPA_REMOVE);

		// Free the old array and their provider sets
		aspa_array_free(old_array, true);
	}

	if (notify_dst)
		// Notify dst clients the records from src are added
		for (size_t i = 0; i < new_array->size; i++)
			aspa_table_notify_clients(dst, aspa_array_get_record(new_array, i), rtr_socket, ASPA_ADD);

	return ASPA_SUCCESS;
}